

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

aim_t * __thiscall aim_t::Clone(aim_t *__return_storage_ptr__,aim_t *this)

{
  aim_t *this_local;
  aim_t *cloned;
  
  aim_t(__return_storage_ptr__);
  TVector2<double>::operator=(&__return_storage_ptr__->aimtrace,&this->aimtrace);
  TAngle<double>::operator=(&__return_storage_ptr__->aimpitch,&this->aimpitch);
  __return_storage_ptr__->aimtarget = this->aimtarget;
  __return_storage_ptr__->attackrange = this->attackrange;
  __return_storage_ptr__->shootthing = this->shootthing;
  __return_storage_ptr__->friender = this->friender;
  __return_storage_ptr__->shootz = this->shootz;
  __return_storage_ptr__->unlinked = (bool)(this->unlinked & 1);
  __return_storage_ptr__->flags = this->flags;
  return __return_storage_ptr__;
}

Assistant:

aim_t Clone()
	{
		aim_t cloned;

		cloned.aimtrace = aimtrace;
		cloned.aimpitch = aimpitch;
		cloned.aimtarget = aimtarget;
		cloned.attackrange = attackrange;
		cloned.shootthing = shootthing;
		cloned.friender = friender;
		cloned.shootz = shootz;
		cloned.unlinked = unlinked;
		cloned.flags = flags;
		return cloned;
	}